

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::PackageSymbol::PackageSymbol
          (PackageSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          NetType *defaultNetType,VariableLifetime defaultLifetime)

{
  string_view name_00;
  char *in_RCX;
  Scope *in_RDX;
  Symbol *in_RDI;
  SourceLocation in_R8;
  SyntaxNode *in_R9;
  undefined4 in_stack_00000008;
  
  name_00._M_str = in_RCX;
  name_00._M_len = (size_t)in_RDX;
  Symbol::Symbol(in_RDI,Package,name_00,in_R8);
  Scope::Scope(in_RDX,(Compilation *)in_R8,in_RDI);
  in_RDI[1].originatingSyntax = in_R9;
  std::optional<slang::TimeScale>::optional((optional<slang::TimeScale> *)0x8a8d87);
  *(undefined4 *)&in_RDI[2].name._M_len = in_stack_00000008;
  std::span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL> *)
             0x8a8da2);
  *(undefined1 *)&in_RDI[2].parentScope = 0;
  return;
}

Assistant:

PackageSymbol::PackageSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                             const NetType& defaultNetType, VariableLifetime defaultLifetime) :
    Symbol(SymbolKind::Package, name, loc), Scope(compilation, this),
    defaultNetType(defaultNetType), defaultLifetime(defaultLifetime) {
}